

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

bool __thiscall duckdb::Expression::IsVolatile(Expression *this)

{
  bool is_volatile;
  undefined1 local_29;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &local_29;
  local_29 = 0;
  local_28._8_8_ = 0;
  local_10 = ::std::
             _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/expression.cpp:43:47)>
             ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/expression.cpp:43:47)>
             ::_M_manager;
  ExpressionIterator::EnumerateChildren
            (this,(function<void_(const_duckdb::Expression_&)> *)&local_28);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return (bool)local_29;
}

Assistant:

bool Expression::IsVolatile() const {
	bool is_volatile = false;
	ExpressionIterator::EnumerateChildren(*this, [&](const Expression &child) {
		if (child.IsVolatile()) {
			is_volatile = true;
		}
	});
	return is_volatile;
}